

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::PopEvalStack
          (WasmBytecodeGenerator *this,WasmType expectedType,char16 *mismatchMessage)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EmitInfo EVar4;
  WasmCompilationException *this_00;
  char16 *pcVar5;
  char16 *pcVar6;
  WasmType type;
  
  if ((this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x819,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar2) goto LAB_00f21d85;
    *puVar3 = 0;
  }
  EVar4 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                    (&this->m_evalStack);
  if ((ulong)EVar4 >> 0x20 == 6) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_00,L"Reached end of stack");
  }
  else {
    type = EVar4.type;
    if (type == expectedType || (type == Any || expectedType == Any)) {
      if ((type == Any) && (this->isUnreachable == false)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x829,"(info.type != WasmTypes::Any || IsUnreachable())",
                           "info.type != WasmTypes::Any || IsUnreachable()");
        if (!bVar2) {
LAB_00f21d85:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      return EVar4;
    }
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    if (mismatchMessage == (char16 *)0x0) {
      pcVar5 = WasmTypes::GetTypeName(expectedType);
      pcVar6 = WasmTypes::GetTypeName(type);
      WasmCompilationException::WasmCompilationException
                (this_00,L"Type mismatch. Expected %s, got %s",pcVar5,pcVar6);
    }
    else {
      WasmCompilationException::WasmCompilationException(this_00,mismatchMessage);
    }
  }
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::PopEvalStack(WasmTypes::WasmType expectedType, const char16* mismatchMessage)
{
    // The scope marker should at least be there
    Assert(!m_evalStack.Empty());
    EmitInfo info = m_evalStack.Pop();
    if (info.type == WasmTypes::Limit)
    {
        throw WasmCompilationException(_u("Reached end of stack"));
    }
    if (expectedType != WasmTypes::Any &&
        info.type != WasmTypes::Any &&
        info.type != expectedType)
    {
        if (!mismatchMessage)
        {
            throw WasmCompilationException(_u("Type mismatch. Expected %s, got %s"), GetTypeName(expectedType), GetTypeName(info.type));
        }
        throw WasmCompilationException(mismatchMessage);
    }
    Assert(info.type != WasmTypes::Any || IsUnreachable());
    return info;
}